

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv_fs_link(uv_loop_t *loop,uv_fs_t *req,char *path,char *new_path,uv_fs_cb cb)

{
  size_t sVar1;
  uv__work *w;
  uv__work *w_00;
  void *pvVar2;
  char *in_RCX;
  uv__work *in_RDX;
  uv_req_t *in_RSI;
  uv_loop_t *in_RDI;
  uv_loop_t *in_R8;
  size_t new_path_len;
  size_t path_len;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_4;
  
  uv__req_init(in_RDI,in_RSI,UV_FS);
  *(undefined4 *)&in_RSI[1].data = 0x15;
  in_RSI[1].active_queue[1] = (void *)0x0;
  in_RSI[2].data = (void *)0x0;
  *(uv_loop_t **)&in_RSI[1].type = in_RDI;
  *(undefined8 *)&in_RSI[2].type = 0;
  in_RSI[7].active_queue[0] = (void *)0x0;
  in_RSI[1].active_queue[0] = in_R8;
  sVar1 = strlen((char *)in_RDX);
  w = (uv__work *)(sVar1 + 1);
  sVar1 = strlen(in_RCX);
  w_00 = (uv__work *)(sVar1 + 1);
  pvVar2 = malloc((size_t)((long)w_00->wq + (long)(w->wq + -6)));
  *(void **)&in_RSI[2].type = pvVar2;
  if (*(long *)&in_RSI[2].type == 0) {
    local_4 = -0xc;
  }
  else {
    in_RSI[7].active_queue[0] = (void *)((long)w->wq + *(long *)&in_RSI[2].type + -0x18);
    memcpy(*(void **)&in_RSI[2].type,in_RDX,(size_t)w);
    memcpy(in_RSI[7].active_queue[0],in_RCX,(size_t)w_00);
    if (in_R8 == (uv_loop_t *)0x0) {
      uv__fs_work(in_RDX);
      uv__fs_done(w_00,in_stack_ffffffffffffffbc);
      local_4 = (int)in_RSI[1].active_queue[1];
    }
    else {
      uv__work_submit(in_R8,w,(_func_void_uv__work_ptr *)w_00,
                      (_func_void_uv__work_ptr_int *)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int uv_fs_link(uv_loop_t* loop,
               uv_fs_t* req,
               const char* path,
               const char* new_path,
               uv_fs_cb cb) {
  INIT(LINK);
  PATH2;
  POST;
}